

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O0

Variable * var_ht_get(VarHashTable *ht,VarHTItemKey key)

{
  uint32_t uVar1;
  uint uVar2;
  Variable *value;
  uint32_t index;
  VarHashTable *ht_local;
  VarHTItemKey key_local;
  
  uVar1 = var_hash(key);
  uVar2 = uVar1 & ht->cap - 1;
  if ((ht->buckets[uVar2] == (VarHTItem *)0x0) ||
     (key_local.ident_length = (size_t)find(ht->buckets[uVar2],key),
     (Variable *)key_local.ident_length == (Variable *)0x0)) {
    key_local.ident_length = 0;
  }
  return (Variable *)key_local.ident_length;
}

Assistant:

Variable *var_ht_get(VarHashTable *ht, VarHTItemKey key) {
    uint32_t index = var_hash(key) & (ht->cap - 1);

    if (ht->buckets[index] != NULL) {
        Variable *value = find(ht->buckets[index], key);
        if (value) {
            return value;
        }
    }

    return NULL;
}